

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O2

int_t zLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                double fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                doublecomplex **dwork)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ExpHeader *pEVar7;
  void *pvVar8;
  void *pvVar9;
  int_t *addr;
  int_t *addr_00;
  int_t *piVar10;
  int n_00;
  int_t *piVar11;
  undefined4 in_register_00000084;
  int *piVar12;
  int *piVar13;
  int_t *piVar14;
  int local_17c;
  int local_178;
  int local_174;
  int *local_170;
  int local_164;
  undefined8 local_160;
  int_t *local_158;
  int_t *local_150;
  int_t *local_148;
  int *local_140;
  char msg [256];
  
  local_160 = CONCAT44(in_register_00000084,n);
  Glu->n = n;
  Glu->num_expansions = 0;
  local_174 = annz;
  local_170 = (int *)fill_ratio;
  pEVar7 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar7;
  if (pEVar7 == (ExpHeader *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zmemory.c");
    superlu_abort_and_exit(msg);
  }
  local_164 = m;
  if (fact == SamePattern_SameRowPerm) {
    pvVar8 = L->Store;
    pvVar9 = U->Store;
    piVar12 = *(int **)((long)pvVar8 + 0x30);
    piVar13 = *(int **)((long)pvVar8 + 0x28);
    piVar11 = *(int_t **)((long)pvVar8 + 0x10);
    piVar14 = *(int_t **)((long)pvVar8 + 0x20);
    piVar10 = *(int_t **)((long)pvVar9 + 0x18);
    iVar6 = Glu->nzlmax;
    local_174 = Glu->nzumax;
    iVar4 = Glu->nzlumax;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return (int)local_160 * 0x15 + (iVar6 + (panel_size * 2 + 7) * m) * 4 + local_174 * 0x14 +
               (panel_size + 1) * m * 0x10 + iVar4 * 0x10 + 0x14;
      }
      Glu->MemModel = USER;
      iVar3 = lwork / 4 << 2;
      (Glu->stack).top2 = iVar3;
      (Glu->stack).size = iVar3;
    }
    local_170 = (int *)CONCAT44(local_170._4_4_,iVar4);
    addr = *(int_t **)((long)pvVar8 + 0x18);
    pEVar7 = Glu->expanders;
    pEVar7[2].mem = addr;
    pvVar8 = *(void **)((long)pvVar8 + 8);
    pEVar7->mem = pvVar8;
    addr_00 = *(int_t **)((long)pvVar9 + 0x10);
    pEVar7[3].mem = addr_00;
    pvVar9 = *(void **)((long)pvVar9 + 8);
    pEVar7[1].mem = pvVar9;
    pEVar7[2].size = iVar6;
    pEVar7->size = iVar4;
    pEVar7[3].size = local_174;
    pEVar7[1].size = local_174;
    iVar3 = local_174;
  }
  else {
    local_17c = (int)((double)local_174 * (double)local_170);
    if (lwork == -1) {
      return (panel_size * 0x18 + 0x2c) * m + (int)local_160 * 0x15 + local_17c * 0x28 + 0x14;
    }
    local_178 = local_17c;
    msg._0_4_ = local_17c;
    zSetupSpace(work,lwork,Glu);
    if (Glu->MemModel == SYSTEM) {
      iVar6 = (int)local_160 + 1;
      local_170 = int32Malloc(iVar6);
      local_140 = int32Malloc(iVar6);
      local_148 = intMalloc(iVar6);
      local_150 = intMalloc(iVar6);
      local_158 = intMalloc(iVar6);
    }
    else {
      iVar6 = (int)local_160 * 4 + 4;
      local_170 = (int *)zuser_malloc(iVar6,0,Glu);
      local_140 = (int *)zuser_malloc(iVar6,0,Glu);
      local_148 = (int_t *)zuser_malloc(iVar6,0,Glu);
      local_150 = (int_t *)zuser_malloc(iVar6,0,Glu);
      local_158 = (int_t *)zuser_malloc(iVar6,0,Glu);
    }
    pvVar8 = zexpand(&local_17c,LUSUP,0,0,Glu);
    pvVar9 = zexpand(&local_178,UCOL,0,0,Glu);
    addr = (int_t *)zexpand((int_t *)msg,LSUB,0,0,Glu);
    while (addr_00 = (int_t *)zexpand(&local_178,USUB,0,1,Glu), piVar10 = local_158,
          piVar11 = local_150, piVar12 = local_170, piVar13 = local_140, piVar14 = local_148,
          iVar6 = msg._0_4_, iVar4 = local_17c, iVar3 = local_178,
          (addr_00 == (int_t *)0x0 || addr == (int_t *)0x0) ||
          (pvVar9 == (void *)0x0 || pvVar8 == (void *)0x0)) {
      if (Glu->MemModel == SYSTEM) {
        superlu_free(pvVar8);
        superlu_free(pvVar9);
        superlu_free(addr);
        superlu_free(addr_00);
      }
      else {
        iVar6 = local_178 * 0x14 + local_17c * 0x10 + msg._0_4_ * 4;
        uVar1 = (Glu->stack).used;
        uVar2 = (Glu->stack).top1;
        (Glu->stack).used = uVar1 - iVar6;
        (Glu->stack).top1 = uVar2 - iVar6;
      }
      iVar6 = local_17c / 2;
      iVar4 = local_178 / 2;
      iVar3 = (int)msg._0_4_ / 2;
      local_17c = iVar6;
      local_178 = iVar4;
      msg._0_4_ = iVar3;
      if (iVar6 < local_174) {
        puts("Not enough memory to perform factorization.");
        return (int)local_160 * 0x29 + iVar6 * 0x10 + iVar4 * 0x14 + iVar3 * 4;
      }
      pvVar8 = zexpand(&local_17c,LUSUP,0,0,Glu);
      pvVar9 = zexpand(&local_178,UCOL,0,0,Glu);
      addr = (int_t *)zexpand((int_t *)msg,LSUB,0,0,Glu);
    }
  }
  Glu->xsup = piVar12;
  Glu->supno = piVar13;
  Glu->lsub = addr;
  Glu->xlsub = piVar14;
  Glu->lusup = pvVar8;
  Glu->xlusup = piVar11;
  Glu->ucol = pvVar9;
  Glu->usub = addr_00;
  Glu->xusub = piVar10;
  Glu->nzlmax = iVar6;
  Glu->nzumax = iVar3;
  Glu->nzlumax = iVar4;
  n_00 = (int)local_160;
  iVar5 = zLUWorkInit(local_164,n_00,panel_size,iwork,dwork,Glu);
  if (iVar5 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar6 = 0;
  }
  else {
    iVar6 = n_00 * 0x29 + iVar6 * 4 + iVar4 * 0x10 + iVar5 + iVar3 * 0x14;
  }
  return iVar6;
}

Assistant:

int_t
zLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, double fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, doublecomplex **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    doublecomplex   *lusup;
    int_t    *xlusup;
    doublecomplex   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(doublecomplex);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    zSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("zLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)zuser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)zuser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = zuser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = zuser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = zuser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (doublecomplex *) zexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (doublecomplex *) zexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) zexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) zexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		zuser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (zmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("zLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (doublecomplex *) zexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (doublecomplex *) zexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) zexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) zexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = zLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + zmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}